

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MiniscriptIntrinsics.cpp
# Opt level: O2

IntrinsicResult MiniScript::intrinsic_floor(Context *context,IntrinsicResult partialResult)

{
  Value x;
  Value local_38;
  String local_28;
  
  String::String(&local_28,"x");
  Context::GetVar((Context *)&x,(String *)partialResult.rs,(LocalOnlyMode)&local_28);
  String::~String(&local_28);
  if (x.type != Number) {
    x.data.number = 0.0;
  }
  local_38.data.number = floor(x.data.number);
  local_38.type = Number;
  local_38.noInvoke = false;
  local_38.localOnly = Off;
  IntrinsicResult::IntrinsicResult((IntrinsicResult *)context,&local_38,true);
  Value::~Value(&local_38);
  Value::~Value(&x);
  return (IntrinsicResult)(IntrinsicResultStorage *)context;
}

Assistant:

static IntrinsicResult intrinsic_floor(Context *context, IntrinsicResult partialResult) {
		Value x = context->GetVar("x");
		return IntrinsicResult(floor(x.DoubleValue()));
	}